

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.h
# Opt level: O0

DoubleRange * __thiscall
CoreML::Specification::DoubleParameter::mutable_range(DoubleParameter *this)

{
  bool bVar1;
  DoubleRange *this_00;
  DoubleParameter *this_local;
  
  bVar1 = has_range(this);
  if (!bVar1) {
    clear_AllowedValues(this);
    set_has_range(this);
    this_00 = (DoubleRange *)operator_new(0x28);
    DoubleRange::DoubleRange(this_00);
    (this->AllowedValues_).range_ = this_00;
  }
  return (this->AllowedValues_).range_;
}

Assistant:

inline ::CoreML::Specification::DoubleRange* DoubleParameter::mutable_range() {
  if (!has_range()) {
    clear_AllowedValues();
    set_has_range();
    AllowedValues_.range_ = new ::CoreML::Specification::DoubleRange;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DoubleParameter.range)
  return AllowedValues_.range_;
}